

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_UUID ON_MeshCache::MeshIdFromMeshType(mesh_type mesh_type)

{
  ON_UUID OVar1;
  undefined1 auStack_18 [4];
  mesh_type mesh_type_local;
  uchar local_10 [8];
  
  switch(mesh_type) {
  case default_mesh:
    auStack_18 = (undefined1  [4])0x85d9e08d;
    mesh_type_local._0_2_ = 0x386c;
    mesh_type_local._2_2_ = 0x45c3;
    local_10[0] = 0x83;
    local_10[1] = 0xdc;
    local_10[2] = '\f';
    local_10[3] = '5';
    local_10[4] = 'F';
    local_10[5] = 0x85;
    local_10[6] = 0xd5;
    local_10[7] = '\x04';
    break;
  case render_mesh:
    auStack_18 = (undefined1  [4])0xf5e3baa9;
    mesh_type_local._0_2_ = 0xa7a2;
    mesh_type_local._2_2_ = 0x49fd;
    local_10[0] = 0xb8;
    local_10[1] = 0xa1;
    local_10[2] = 'f';
    local_10[3] = 0xeb;
    local_10[4] = '\'';
    local_10[5] = 'J';
    local_10[6] = '_';
    local_10[7] = 0x91;
    break;
  case analysis_mesh:
    auStack_18 = (undefined1  [4])0xac12f955;
    mesh_type_local._0_2_ = 0xa29f;
    mesh_type_local._2_2_ = 0x437b;
    local_10[0] = 0xa4;
    local_10[1] = 0xc9;
    local_10[2] = '\x06';
    local_10[3] = 200;
    local_10[4] = '[';
    local_10[5] = '\x7f';
    local_10[6] = 0xf5;
    local_10[7] = '|';
    break;
  case preview_mesh:
    auStack_18 = (undefined1  [4])0x3aaca7f2;
    mesh_type_local._0_2_ = 0x444;
    mesh_type_local._2_2_ = 0x4587;
    local_10[0] = 0x80;
    local_10[1] = 0x83;
    local_10[2] = 0xa1;
    local_10[3] = '<';
    local_10[4] = '[';
    local_10[5] = 0xa0;
    local_10[6] = 0xae;
    local_10[7] = 'P';
    break;
  case any_mesh:
    auStack_18 = (undefined1  [4])0xa82c0f1b;
    mesh_type_local._0_2_ = 0x13e8;
    mesh_type_local._2_2_ = 0x4dec;
    local_10[0] = 0xad;
    local_10[1] = '5';
    local_10[2] = 0xd3;
    local_10[3] = 0xdd;
    local_10[4] = 0xd2;
    local_10[5] = 'w';
    local_10[6] = ' ';
    local_10[7] = '<';
    break;
  default:
    auStack_18 = (undefined1  [4])0x0;
    mesh_type_local._0_2_ = 0;
    mesh_type_local._2_2_ = 0;
    local_10[0] = '\0';
    local_10[1] = '\0';
    local_10[2] = '\0';
    local_10[3] = '\0';
    local_10[4] = '\0';
    local_10[5] = '\0';
    local_10[6] = '\0';
    local_10[7] = '\0';
  }
  OVar1.Data4[0] = local_10[0];
  OVar1.Data4[1] = local_10[1];
  OVar1.Data4[2] = local_10[2];
  OVar1.Data4[3] = local_10[3];
  OVar1.Data4[4] = local_10[4];
  OVar1.Data4[5] = local_10[5];
  OVar1.Data4[6] = local_10[6];
  OVar1.Data4[7] = local_10[7];
  OVar1.Data1 = (uint)auStack_18;
  OVar1.Data2 = (undefined2)mesh_type_local;
  OVar1.Data3 = mesh_type_local._2_2_;
  return OVar1;
}

Assistant:

ON_UUID ON_MeshCache::MeshIdFromMeshType(
  ON::mesh_type mesh_type
  )
{
  switch (mesh_type)
  {
  case ON::default_mesh:
    return ON_MeshCache::CoarseMeshId;
    break;
  case ON::render_mesh:
    return ON_MeshCache::RenderMeshId;
    break;
  case ON::analysis_mesh:
    return ON_MeshCache::AnalysisMeshId;
    break;
  case ON::preview_mesh:
    return ON_MeshCache::PreviewMeshId;
    break;
  case ON::any_mesh:
    return ON_MeshCache::AnyMeshId;
    break;
  default:
    break;
  }

  return ON_nil_uuid;
}